

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spanning_tree.cc
# Opt level: O0

void __thiscall VW::SpanningTree::Run(SpanningTree *this)

{
  uint16_t uVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  ostream *poVar5;
  undefined8 uVar6;
  ssize_t sVar7;
  mapped_type *pmVar8;
  void *__ptr;
  void *__ptr_00;
  byte *in_RDI;
  bool bVar9;
  uint32_t bogus2;
  int bogus;
  size_t i_4;
  int done;
  size_t i_3;
  uint16_t *client_ports;
  size_t i_2;
  int root;
  uint16_t *kid_count;
  int *parent;
  size_t i_1;
  size_t i;
  partial partial_nodeset;
  int ok;
  size_t id;
  size_t total;
  size_t nonce;
  char __errmsg_2 [256];
  stringstream __msg_2;
  char servInfo [32];
  char hostname [1025];
  char __errmsg_1 [256];
  stringstream __msg_1;
  char dotted_quad [16];
  socket_t f;
  socklen_t size;
  sockaddr_in client_address;
  char __errmsg [256];
  stringstream __msg;
  map<unsigned_long,_partial,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_partial>_>_>
  partial_nodesets;
  undefined4 uVar10;
  undefined4 in_stack_ffffffffffffefec;
  ostream *in_stack_ffffffffffffeff0;
  ostream *in_stack_fffffffffffff008;
  ssize_t in_stack_fffffffffffff010;
  int iVar11;
  undefined4 in_stack_fffffffffffff018;
  int in_stack_fffffffffffff01c;
  vw_exception *in_stack_fffffffffffff020;
  ostream *in_stack_fffffffffffff028;
  ostream *in_stack_fffffffffffff030;
  void *local_d58;
  void *local_d48;
  void *in_stack_fffffffffffff2c0;
  void *in_stack_fffffffffffff2c8;
  int in_stack_fffffffffffff2d4;
  void *local_d18;
  void *local_d10;
  _Self local_d08;
  _Self local_d00;
  client *local_cf8;
  void *pvStack_cf0;
  uint local_cdc;
  void *local_cd8;
  void *local_cd0;
  ulong local_cc8;
  undefined1 local_cb9;
  char local_c98 [264];
  stringstream local_b90 [16];
  ostream local_b80 [376];
  char local_a08 [32];
  char local_9e8 [1039];
  undefined1 local_5d9;
  char local_5b8 [264];
  stringstream local_4b0 [16];
  ostream local_4a0 [376];
  char local_328 [20];
  int local_314;
  socklen_t local_310;
  sockaddr local_30c;
  undefined1 local_2f9;
  char local_2d8 [280];
  stringstream local_1c0 [16];
  ostream local_1b0 [432];
  
  std::
  map<unsigned_long,_partial,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_partial>_>_>
  ::map((map<unsigned_long,_partial,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_partial>_>_>
         *)0x1055bc);
  do {
    if (((*in_RDI ^ 0xff) & 1) == 0) {
LAB_00106b31:
      std::
      map<unsigned_long,_partial,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_partial>_>_>
      ::~map((map<unsigned_long,_partial,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_partial>_>_>
              *)0x106b3e);
      return;
    }
    iVar2 = listen(*(int *)(in_RDI + 4),0x400);
    iVar11 = (int)((ulong)in_stack_fffffffffffff010 >> 0x20);
    if (iVar2 < 0) {
      std::__cxx11::stringstream::stringstream(local_1c0);
      std::operator<<(local_1b0,"listen: ");
      piVar3 = __errno_location();
      pcVar4 = strerror_r(*piVar3,local_2d8,0x100);
      if (pcVar4 == (char *)0x0) {
        poVar5 = std::operator<<(local_1b0,"errno = ");
        std::operator<<(poVar5,local_2d8);
      }
      else {
        std::operator<<(local_1b0,"errno = unknown");
      }
      local_2f9 = 1;
      uVar6 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      vw_exception::vw_exception
                (in_stack_fffffffffffff020,
                 (char *)CONCAT44(in_stack_fffffffffffff01c,in_stack_fffffffffffff018),iVar11,
                 (string *)in_stack_fffffffffffff008);
      local_2f9 = 0;
      __cxa_throw(uVar6,&vw_exception::typeinfo,vw_exception::~vw_exception);
    }
    local_310 = 0x10;
    local_314 = accept(*(int *)(in_RDI + 4),&local_30c,&local_310);
    if (local_314 < 0) goto LAB_00106b31;
    pcVar4 = inet_ntop(2,local_30c.sa_data + 2,local_328,0x10);
    iVar2 = (int)((ulong)in_stack_fffffffffffff010 >> 0x20);
    if (pcVar4 == (char *)0x0) {
      std::__cxx11::stringstream::stringstream(local_4b0);
      std::operator<<(local_4a0,"inet_ntop: ");
      piVar3 = __errno_location();
      pcVar4 = strerror_r(*piVar3,local_5b8,0x100);
      if (pcVar4 == (char *)0x0) {
        poVar5 = std::operator<<(local_4a0,"errno = ");
        std::operator<<(poVar5,local_5b8);
      }
      else {
        std::operator<<(local_4a0,"errno = unknown");
      }
      local_5d9 = 1;
      uVar6 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      vw_exception::vw_exception
                (in_stack_fffffffffffff020,
                 (char *)CONCAT44(in_stack_fffffffffffff01c,in_stack_fffffffffffff018),iVar2,
                 (string *)in_stack_fffffffffffff008);
      local_5d9 = 0;
      __cxa_throw(uVar6,&vw_exception::typeinfo,vw_exception::~vw_exception);
    }
    uVar10 = 0;
    iVar2 = getnameinfo(&local_30c,0x10,local_9e8,0x401,local_a08,0x20,0);
    iVar11 = (int)((ulong)in_stack_fffffffffffff010 >> 0x20);
    if (iVar2 != 0) {
      std::__cxx11::stringstream::stringstream(local_b90);
      std::operator<<(local_b80,"getnameinfo: ");
      piVar3 = __errno_location();
      pcVar4 = strerror_r(*piVar3,local_c98,0x100);
      if (pcVar4 == (char *)0x0) {
        poVar5 = std::operator<<(local_b80,"errno = ");
        std::operator<<(poVar5,local_c98);
      }
      else {
        std::operator<<(local_b80,"errno = unknown");
      }
      local_cb9 = 1;
      uVar6 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      vw_exception::vw_exception
                (in_stack_fffffffffffff020,
                 (char *)CONCAT44(in_stack_fffffffffffff01c,in_stack_fffffffffffff018),iVar11,
                 (string *)in_stack_fffffffffffff008);
      local_cb9 = 0;
      __cxa_throw(uVar6,&vw_exception::typeinfo,vw_exception::~vw_exception);
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,"inbound connection from ");
    poVar5 = std::operator<<(poVar5,local_328);
    poVar5 = std::operator<<(poVar5,"(");
    poVar5 = std::operator<<(poVar5,local_9e8);
    poVar5 = std::operator<<(poVar5,':');
    uVar1 = ntohs(*(uint16_t *)(in_RDI + 8));
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar1);
    poVar5 = std::operator<<(poVar5,") serv=");
    poVar5 = std::operator<<(poVar5,local_a08);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    local_cc8 = 0;
    sVar7 = recv(local_314,&local_cc8,8,0);
    if (sVar7 != 8) {
      poVar5 = std::operator<<((ostream *)&std::cerr,local_328);
      poVar5 = std::operator<<(poVar5,"(");
      poVar5 = std::operator<<(poVar5,local_9e8);
      poVar5 = std::operator<<(poVar5,':');
      uVar1 = ntohs(*(uint16_t *)(in_RDI + 8));
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar1);
      poVar5 = std::operator<<(poVar5,"): nonce read failed, exiting");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,local_328);
    poVar5 = std::operator<<(poVar5,"(");
    poVar5 = std::operator<<(poVar5,local_9e8);
    poVar5 = std::operator<<(poVar5,':');
    uVar1 = ntohs(*(uint16_t *)(in_RDI + 8));
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar1);
    poVar5 = std::operator<<(poVar5,"): nonce=");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_cc8);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    local_cd0 = (void *)0x0;
    sVar7 = recv(local_314,&local_cd0,8,0);
    if (sVar7 != 8) {
      poVar5 = std::operator<<((ostream *)&std::cerr,local_328);
      poVar5 = std::operator<<(poVar5,"(");
      poVar5 = std::operator<<(poVar5,local_9e8);
      poVar5 = std::operator<<(poVar5,':');
      uVar1 = ntohs(*(uint16_t *)(in_RDI + 8));
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar1);
      poVar5 = std::operator<<(poVar5,"): total node count read failed, exiting");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,local_328);
    poVar5 = std::operator<<(poVar5,"(");
    poVar5 = std::operator<<(poVar5,local_9e8);
    poVar5 = std::operator<<(poVar5,':');
    uVar1 = ntohs(*(uint16_t *)(in_RDI + 8));
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar1);
    poVar5 = std::operator<<(poVar5,"): total=");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ulong)local_cd0);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    local_cd8 = (void *)0x0;
    sVar7 = recv(local_314,&local_cd8,8,0);
    if (sVar7 != 8) {
      poVar5 = std::operator<<((ostream *)&std::cerr,local_328);
      poVar5 = std::operator<<(poVar5,"(");
      poVar5 = std::operator<<(poVar5,local_9e8);
      poVar5 = std::operator<<(poVar5,':');
      uVar1 = ntohs(*(uint16_t *)(in_RDI + 8));
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar1);
      poVar5 = std::operator<<(poVar5,"): node id read failed, exiting");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,local_328);
    poVar5 = std::operator<<(poVar5,"(");
    poVar5 = std::operator<<(poVar5,local_9e8);
    poVar5 = std::operator<<(poVar5,':');
    uVar1 = ntohs(*(uint16_t *)(in_RDI + 8));
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar1);
    poVar5 = std::operator<<(poVar5,"): node id=");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ulong)local_cd8);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    local_cdc = 1;
    bVar9 = local_cd0 <= local_cd8;
    if (bVar9) {
      poVar5 = std::operator<<((ostream *)&std::cout,local_328);
      poVar5 = std::operator<<(poVar5,"(");
      poVar5 = std::operator<<(poVar5,local_9e8);
      poVar5 = std::operator<<(poVar5,':');
      uVar1 = ntohs(*(uint16_t *)(in_RDI + 8));
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar1);
      poVar5 = std::operator<<(poVar5,"): invalid id=");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ulong)local_cd8);
      poVar5 = std::operator<<(poVar5," >=  ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ulong)local_cd0);
      poVar5 = std::operator<<(poVar5," !");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    local_cdc = (uint)!bVar9;
    local_d00._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_partial,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_partial>_>_>
         ::find((map<unsigned_long,_partial,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_partial>_>_>
                 *)CONCAT44(in_stack_ffffffffffffefec,uVar10),(key_type *)0x10646f);
    local_d08._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_partial,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_partial>_>_>
         ::end((map<unsigned_long,_partial,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_partial>_>_>
                *)CONCAT44(in_stack_ffffffffffffefec,uVar10));
    bVar9 = std::operator==(&local_d00,&local_d08);
    if (bVar9) {
      local_cf8 = (client *)calloc((size_t)local_cd0,8);
      for (local_d10 = (void *)0x0; local_d10 < local_cd0; local_d10 = (void *)((long)local_d10 + 1)
          ) {
        local_cf8[(long)local_d10].client_ip = 0xffffffff;
      }
      pvStack_cf0 = (void *)0x0;
    }
    else {
      pmVar8 = std::
               map<unsigned_long,_partial,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_partial>_>_>
               ::operator[]((map<unsigned_long,_partial,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_partial>_>_>
                             *)in_stack_fffffffffffff030,(key_type *)in_stack_fffffffffffff028);
      local_cf8 = pmVar8->nodes;
      pvStack_cf0 = (void *)pmVar8->filled;
      std::
      map<unsigned_long,_partial,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_partial>_>_>
      ::erase((map<unsigned_long,_partial,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_partial>_>_>
               *)in_stack_ffffffffffffeff0,(key_type *)CONCAT44(in_stack_ffffffffffffefec,uVar10));
    }
    if ((local_cdc != 0) && (local_cf8[(long)local_cd8].client_ip != 0xffffffff)) {
      local_cdc = 0;
    }
    fail_send(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2c8,
              (int)((ulong)in_stack_fffffffffffff2c0 >> 0x20));
    if (local_cdc != 0) {
      local_cf8[(long)local_cd8].client_ip = local_30c.sa_data._2_4_;
      local_cf8[(long)local_cd8].socket = local_314;
      pvStack_cf0 = (void *)((long)pvStack_cf0 + 1);
    }
    if (pvStack_cf0 == local_cd0) {
      qsort(local_cf8,(size_t)local_cd0,8,socket_sort);
      __ptr = calloc((size_t)local_cd0,4);
      __ptr_00 = calloc((size_t)local_cd0,2);
      in_stack_fffffffffffff01c =
           build_tree((int *)in_stack_fffffffffffff028,(uint16_t *)in_stack_fffffffffffff020,
                      CONCAT44(in_stack_fffffffffffff01c,in_stack_fffffffffffff018),
                      (int)((ulong)in_stack_fffffffffffff010 >> 0x20));
      *(undefined4 *)((long)__ptr + (long)in_stack_fffffffffffff01c * 4) = 0xffffffff;
      in_stack_fffffffffffff2d4 = in_stack_fffffffffffff01c;
      for (in_stack_fffffffffffff2c8 = (void *)0x0; in_stack_fffffffffffff2c8 < local_cd0;
          in_stack_fffffffffffff2c8 = (void *)((long)in_stack_fffffffffffff2c8 + 1)) {
        fail_send(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2c8,
                  (int)((ulong)in_stack_fffffffffffff2c0 >> 0x20));
      }
      in_stack_fffffffffffff2c0 = calloc((size_t)local_cd0,2);
      for (local_d48 = (void *)0x0; local_d48 < local_cd0; local_d48 = (void *)((long)local_d48 + 1)
          ) {
        in_stack_fffffffffffff010 =
             recv(local_cf8[(long)local_d48].socket,
                  (void *)((long)in_stack_fffffffffffff2c0 + (long)local_d48 * 2),2,0);
        if (in_stack_fffffffffffff010 < 2) {
          in_stack_fffffffffffff008 =
               std::operator<<((ostream *)&std::cerr," Port read failed for node ");
          poVar5 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffff008,(ulong)local_d48);
          poVar5 = std::operator<<(poVar5," read ");
          in_stack_ffffffffffffeff0 = (ostream *)std::ostream::operator<<(poVar5,0);
          std::ostream::operator<<(in_stack_ffffffffffffeff0,std::endl<char,std::char_traits<char>>)
          ;
        }
      }
      for (local_d58 = (void *)0x0; local_d58 < local_cd0; local_d58 = (void *)((long)local_d58 + 1)
          ) {
        iVar2 = (int)((ulong)in_stack_fffffffffffff2c0 >> 0x20);
        if (*(int *)((long)__ptr + (long)local_d58 * 4) < 0) {
          fail_send(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2c8,iVar2);
          fail_send(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2c8,
                    (int)((ulong)in_stack_fffffffffffff2c0 >> 0x20));
        }
        else {
          fail_send(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2c8,iVar2);
          fail_send(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2c8,
                    (int)((ulong)in_stack_fffffffffffff2c0 >> 0x20));
        }
        close(local_cf8[(long)local_d58].socket);
      }
      free(in_stack_fffffffffffff2c0);
      free(local_cf8);
      free(__ptr);
      free(__ptr_00);
    }
    else {
      pmVar8 = std::
               map<unsigned_long,_partial,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_partial>_>_>
               ::operator[]((map<unsigned_long,_partial,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_partial>_>_>
                             *)in_stack_fffffffffffff030,(key_type *)in_stack_fffffffffffff028);
      pmVar8->nodes = local_cf8;
      pmVar8->filled = (size_t)pvStack_cf0;
      for (local_d18 = (void *)0x0; local_d18 < local_cd0; local_d18 = (void *)((long)local_d18 + 1)
          ) {
        if (local_cf8[(long)local_d18].client_ip == 0xffffffff) {
          poVar5 = std::operator<<((ostream *)&std::cout,"nonce ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_cc8);
          poVar5 = std::operator<<(poVar5," still waiting for ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,(long)local_cd0 - (long)pvStack_cf0);
          poVar5 = std::operator<<(poVar5," nodes out of ");
          in_stack_fffffffffffff030 = (ostream *)std::ostream::operator<<(poVar5,(ulong)local_cd0);
          in_stack_fffffffffffff028 =
               std::operator<<(in_stack_fffffffffffff030," for example node ");
          in_stack_fffffffffffff020 =
               (vw_exception *)std::ostream::operator<<(in_stack_fffffffffffff028,(ulong)local_d18);
          std::ostream::operator<<
                    ((ostream *)in_stack_fffffffffffff020,std::endl<char,std::char_traits<char>>);
          break;
        }
      }
    }
  } while( true );
}

Assistant:

void SpanningTree::Run()
{
  map<size_t, partial> partial_nodesets;
  while (!m_stop)
  {
    if (listen(sock, 1024) < 0)
      THROWERRNO("listen: ");

    sockaddr_in client_address;
    socklen_t size = sizeof(client_address);
    socket_t f = accept(sock, (sockaddr*)&client_address, &size);
#ifdef _WIN32
    if (f == INVALID_SOCKET)
    {
#else
    if (f < 0)
    {
#endif
      break;
    }

    char dotted_quad[INET_ADDRSTRLEN];
    if (NULL == inet_ntop(AF_INET, &(client_address.sin_addr), dotted_quad, INET_ADDRSTRLEN))
      THROWERRNO("inet_ntop: ");

    char hostname[NI_MAXHOST];
    char servInfo[NI_MAXSERV];
    if (getnameinfo((sockaddr*)&client_address, sizeof(sockaddr), hostname, NI_MAXHOST, servInfo, NI_MAXSERV, 0))
      THROWERRNO("getnameinfo: ");

    cerr << "inbound connection from " << dotted_quad << "(" << hostname << ':' << ntohs(port) << ") serv=" << servInfo
         << endl;

    size_t nonce = 0;
    if (recv(f, (char*)&nonce, sizeof(nonce), 0) != sizeof(nonce))
    {
      cerr << dotted_quad << "(" << hostname << ':' << ntohs(port) << "): nonce read failed, exiting" << endl;
      exit(1);
    }
    else
      cerr << dotted_quad << "(" << hostname << ':' << ntohs(port) << "): nonce=" << nonce << endl;
    size_t total = 0;
    if (recv(f, (char*)&total, sizeof(total), 0) != sizeof(total))
    {
      cerr << dotted_quad << "(" << hostname << ':' << ntohs(port) << "): total node count read failed, exiting"
           << endl;
      exit(1);
    }
    else
      cerr << dotted_quad << "(" << hostname << ':' << ntohs(port) << "): total=" << total << endl;
    size_t id = 0;
    if (recv(f, (char*)&id, sizeof(id), 0) != sizeof(id))
    {
      cerr << dotted_quad << "(" << hostname << ':' << ntohs(port) << "): node id read failed, exiting" << endl;
      exit(1);
    }
    else
      cerr << dotted_quad << "(" << hostname << ':' << ntohs(port) << "): node id=" << id << endl;

    int ok = true;
    if (id >= total)
    {
      cout << dotted_quad << "(" << hostname << ':' << ntohs(port) << "): invalid id=" << id << " >=  " << total << " !"
           << endl;
      ok = false;
    }
    partial partial_nodeset;

    if (partial_nodesets.find(nonce) == partial_nodesets.end())
    {
      partial_nodeset.nodes = (client*)calloc(total, sizeof(client));
      for (size_t i = 0; i < total; i++) partial_nodeset.nodes[i].client_ip = (uint32_t)-1;
      partial_nodeset.filled = 0;
    }
    else
    {
      partial_nodeset = partial_nodesets[nonce];
      partial_nodesets.erase(nonce);
    }

    if (ok && partial_nodeset.nodes[id].client_ip != (uint32_t)-1)
      ok = false;
    fail_send(f, &ok, sizeof(ok));

    if (ok)
    {
      partial_nodeset.nodes[id].client_ip = client_address.sin_addr.s_addr;
      partial_nodeset.nodes[id].socket = f;
      partial_nodeset.filled++;
    }
    if (partial_nodeset.filled != total)  // Need to wait for more connections
    {
      partial_nodesets[nonce] = partial_nodeset;
      for (size_t i = 0; i < total; i++)
      {
        if (partial_nodeset.nodes[i].client_ip == (uint32_t)-1)
        {
          cout << "nonce " << nonce << " still waiting for " << (total - partial_nodeset.filled) << " nodes out of "
               << total << " for example node " << i << endl;
          break;
        }
      }
    }
    else
    {
      // Time to make the spanning tree
      qsort(partial_nodeset.nodes, total, sizeof(client), socket_sort);

      int* parent = (int*)calloc(total, sizeof(int));
      uint16_t* kid_count = (uint16_t*)calloc(total, sizeof(uint16_t));

      int root = build_tree(parent, kid_count, total, 0);
      parent[root] = -1;

      for (size_t i = 0; i < total; i++)
      {
        fail_send(partial_nodeset.nodes[i].socket, &kid_count[i], sizeof(kid_count[i]));
      }

      uint16_t* client_ports = (uint16_t*)calloc(total, sizeof(uint16_t));

      for (size_t i = 0; i < total; i++)
      {
        int done = 0;
        if (recv(partial_nodeset.nodes[i].socket, (char*)&(client_ports[i]), sizeof(client_ports[i]), 0) <
            (int)sizeof(client_ports[i]))
          cerr << " Port read failed for node " << i << " read " << done << endl;
      }  // all clients have bound to their ports.

      for (size_t i = 0; i < total; i++)
      {
        if (parent[i] >= 0)
        {
          fail_send(partial_nodeset.nodes[i].socket, &partial_nodeset.nodes[parent[i]].client_ip,
              sizeof(partial_nodeset.nodes[parent[i]].client_ip));
          fail_send(partial_nodeset.nodes[i].socket, &client_ports[parent[i]], sizeof(client_ports[parent[i]]));
        }
        else
        {
          int bogus = -1;
          uint32_t bogus2 = -1;
          fail_send(partial_nodeset.nodes[i].socket, &bogus2, sizeof(bogus2));
          fail_send(partial_nodeset.nodes[i].socket, &bogus, sizeof(bogus));
        }
        CLOSESOCK(partial_nodeset.nodes[i].socket);
      }
      free(client_ports);
      free(partial_nodeset.nodes);
      free(parent);
      free(kid_count);
    }
  }

#ifdef _WIN32
  WSACleanup();
#endif
}
}